

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<unsigned_int_()>::Action
          (Action<unsigned_int_()> *this,ActionInterface<unsigned_int_()> *impl)

{
  __shared_ptr<testing::ActionInterface<unsigned_int()>,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<testing::ActionInterface<unsigned_int()>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<testing::ActionInterface<unsigned_int()>,void>(local_20,impl);
  std::function<unsigned_int()>::function<testing::Action<unsigned_int()>::ActionAdapter,void>
            ((function<unsigned_int()> *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}